

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.h
# Opt level: O2

void __thiscall wabt::MemoryStream::~MemoryStream(MemoryStream *this)

{
  ~MemoryStream(this);
  operator_delete(this,0x28);
  return;
}

Assistant:

MemoryStream(MemoryStream&&) = default;